

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  TriggerPrg **ppTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  sqlite3 *db;
  sqlite3 *db_00;
  Vdbe *p;
  TriggerStep *pStep;
  VdbeOp *pVVar4;
  u8 uVar5;
  int iVar6;
  Parse *pPVar7;
  TriggerPrg *pTVar8;
  SubProgram *pSVar9;
  Parse *pParse_00;
  Vdbe *pVVar10;
  char *zP4;
  Expr *pEVar11;
  SrcList *pSVar12;
  ExprList *pChanges;
  IdList *pColumn;
  Select *pSVar13;
  TriggerPrg **ppTVar14;
  TriggerStep **ppTVar15;
  int local_c4;
  SelectDest local_80;
  undefined1 local_68 [24];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  pPVar7 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar7 = pParse;
  }
  ppTVar1 = &pPVar7->pTriggerPrg;
  ppTVar14 = ppTVar1;
  while( true ) {
    pTVar8 = *ppTVar14;
    if (pTVar8 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar8 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
      if (pTVar8 != (TriggerPrg *)0x0) {
        pTVar8->pNext = *ppTVar1;
        *ppTVar1 = pTVar8;
        pSVar9 = (SubProgram *)sqlite3DbMallocZero(db,0x28);
        pTVar8->pProgram = pSVar9;
        if (pSVar9 != (SubProgram *)0x0) {
          pVVar10 = pPVar7->pVdbe;
          pSVar9->pNext = pVVar10->pProgram;
          pVVar10->pProgram = pSVar9;
          pTVar8->pTrigger = pTrigger;
          pTVar8->orconf = orconf;
          pTVar8->aColmask[0] = 0xffffffff;
          pTVar8->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocZero(db,0x288);
          if (pParse_00 != (Parse *)0x0) {
            local_40 = (undefined1  [16])0x0;
            local_50 = (undefined1  [16])0x0;
            local_68._8_16_ = (undefined1  [16])0x0;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar7;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            local_68._0_8_ = pParse_00;
            pVVar10 = sqlite3GetVdbe(pParse_00);
            if (pVVar10 != (Vdbe *)0x0) {
              local_c4 = 0;
              zP4 = sqlite3MPrintf(db,"-- TRIGGER %s",pTrigger->zName);
              sqlite3VdbeChangeP4(pVVar10,-1,zP4,-1);
              if (pTrigger->pWhen != (Expr *)0x0) {
                local_c4 = 0;
                pEVar11 = sqlite3ExprDup(db,pTrigger->pWhen,0);
                iVar6 = sqlite3ResolveExprNames((NameContext *)local_68,pEVar11);
                if ((iVar6 == 0) && (db->mallocFailed == '\0')) {
                  local_c4 = sqlite3VdbeMakeLabel(pVVar10);
                  sqlite3ExprIfFalse(pParse_00,pEVar11,local_c4,0x10);
                }
                sqlite3ExprDelete(db,pEVar11);
              }
              db_00 = pParse_00->db;
              p = pParse_00->pVdbe;
              ppTVar15 = &pTrigger->step_list;
              while (pStep = *ppTVar15, pStep != (TriggerStep *)0x0) {
                uVar5 = (u8)orconf;
                if (orconf == 10) {
                  uVar5 = pStep->orconf;
                }
                pParse_00->eOrconf = uVar5;
                uVar5 = pStep->op;
                if (uVar5 == 'l') {
                  pSVar12 = targetSrcList(pParse_00,pStep);
                  pSVar13 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  pColumn = sqlite3IdListDup(db_00,pStep->pIdList);
                  sqlite3Insert(pParse_00,pSVar12,pSVar13,pColumn,(uint)pParse_00->eOrconf);
                }
                else if (uVar5 == 'm') {
                  pSVar12 = targetSrcList(pParse_00,pStep);
                  pEVar11 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  sqlite3DeleteFrom(pParse_00,pSVar12,pEVar11);
                }
                else if (uVar5 == 'n') {
                  pSVar12 = targetSrcList(pParse_00,pStep);
                  pChanges = sqlite3ExprListDup(db_00,pStep->pExprList,0);
                  pEVar11 = sqlite3ExprDup(db_00,pStep->pWhere,0);
                  sqlite3Update(pParse_00,pSVar12,pChanges,pEVar11,(uint)pParse_00->eOrconf);
                }
                else {
                  pSVar13 = sqlite3SelectDup(db_00,pStep->pSelect,0);
                  local_80.eDest = '\x04';
                  local_80.affSdst = '\0';
                  local_80.iSDParm = 0;
                  local_80.iSdst = 0;
                  local_80.nSdst = 0;
                  sqlite3Select(pParse_00,pSVar13,&local_80);
                  sqlite3SelectDelete(db_00,pSVar13);
                }
                if (pStep->op != 'w') {
                  sqlite3VdbeAddOp0(p,0x62);
                }
                ppTVar15 = &pStep->pNext;
              }
              if (local_c4 != 0) {
                sqlite3VdbeResolveLabel(pVVar10,local_c4);
              }
              sqlite3VdbeAddOp0(pVVar10,0x18);
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pParse_00->zErrMsg;
                pParse->nErr = pParse_00->nErr;
              }
              else {
                sqlite3DbFree(pParse_00->db,pParse_00->zErrMsg);
              }
              if (db->mallocFailed == '\0') {
                pVVar4 = pVVar10->aOp;
                resolveP2Values(pVVar10,&pPVar7->nMaxArg);
                pSVar9->nOp = pVVar10->nOp;
                pVVar10->aOp = (Op *)0x0;
                pSVar9->aOp = pVVar4;
              }
              uVar2 = pParse_00->nTab;
              uVar3 = pParse_00->nMem;
              pSVar9->nMem = uVar3;
              pSVar9->nCsr = uVar2;
              pSVar9->nOnce = pParse_00->nOnce;
              pSVar9->token = pTrigger;
              pTVar8->aColmask[0] = pParse_00->oldmask;
              pTVar8->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar10);
            }
            sqlite3ParserReset(pParse_00);
            sqlite3DbFree(db,pParse_00);
            return pTVar8;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar8->pTrigger == pTrigger) && (pTVar8->orconf == orconf)) break;
    ppTVar14 = &pTVar8->pNext;
  }
  return pTVar8;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}